

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkSetNodeLevelsArrival(Abc_Ntk_t *pNtkOld)

{
  int iVar1;
  void *pvVar2;
  Mio_Library_t *pMVar3;
  Mio_Gate_t *pMVar4;
  Abc_Obj_t *pNode;
  float fVar5;
  float fVar6;
  int local_28;
  int i;
  float tAndDelay;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNodeOld;
  Abc_Ntk_t *pNtkOld_local;
  
  if ((pNtkOld->pManTime != (Abc_ManTime_t *)0x0) &&
     (pvVar2 = Abc_FrameReadLibGen(), pvVar2 != (void *)0x0)) {
    pMVar3 = (Mio_Library_t *)Abc_FrameReadLibGen();
    pMVar4 = Mio_LibraryReadNand2(pMVar3);
    if (pMVar4 != (Mio_Gate_t *)0x0) {
      pMVar3 = (Mio_Library_t *)Abc_FrameReadLibGen();
      fVar5 = Mio_LibraryReadDelayNand2Max(pMVar3);
      for (local_28 = 0; iVar1 = Abc_NtkCiNum(pNtkOld), local_28 < iVar1; local_28 = local_28 + 1) {
        pNode = Abc_NtkCi(pNtkOld,local_28);
        pvVar2 = (pNode->field_6).pTemp;
        fVar6 = Abc_NodeReadArrivalWorst(pNode);
        *(uint *)((long)pvVar2 + 0x14) =
             *(uint *)((long)pvVar2 + 0x14) & 0xfff | (int)(fVar6 / fVar5) << 0xc;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkSetNodeLevelsArrival( Abc_Ntk_t * pNtkOld )
{
    Abc_Obj_t * pNodeOld, * pNodeNew;
    float tAndDelay;
    int i;
    if ( pNtkOld->pManTime == NULL )
        return;
    if ( Abc_FrameReadLibGen() == NULL || Mio_LibraryReadNand2((Mio_Library_t *)Abc_FrameReadLibGen()) == NULL )
        return;
    tAndDelay = Mio_LibraryReadDelayNand2Max((Mio_Library_t *)Abc_FrameReadLibGen());
    Abc_NtkForEachCi( pNtkOld, pNodeOld, i )
    {
        pNodeNew = pNodeOld->pCopy;
        pNodeNew->Level = (int)(Abc_NodeReadArrivalWorst(pNodeOld) / tAndDelay);
    }
}